

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void check_call_unroll(jit_State *J,TraceNo lnk)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  GCtrace *pGVar5;
  long lVar6;
  int in_ESI;
  long in_RDI;
  int32_t count;
  int32_t depth;
  void *pc;
  cTValue *frame;
  TraceNo in_stack_ffffffffffffffb8;
  TraceLink in_stack_ffffffffffffffbc;
  jit_State *in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  jit_State *local_28;
  
  local_28 = (jit_State *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -8);
  pGVar5 = &local_28->cur;
  local_34 = *(int *)(in_RDI + 0xe4);
  local_38 = 0;
  if ((*(byte *)(*(long *)(in_RDI + 0x80) + 0x25) & 2) != 0) {
    local_34 = local_34 + -1;
  }
  for (; 0 < local_34; local_34 = local_34 + -1) {
    uVar1._0_1_ = (local_28->cur).marked;
    uVar1._1_1_ = (local_28->cur).gct;
    uVar1._2_2_ = (local_28->cur).nsnap;
    if ((uVar1 & 7) == 2) {
      local_34 = local_34 + -1;
    }
    uVar2._0_1_ = (local_28->cur).marked;
    uVar2._1_1_ = (local_28->cur).gct;
    uVar2._2_2_ = (local_28->cur).nsnap;
    if ((uVar2 & 3) == 0) {
      uVar3._0_1_ = (local_28->cur).marked;
      uVar3._1_1_ = (local_28->cur).gct;
      uVar3._2_2_ = (local_28->cur).nsnap;
      lVar6 = (ulong)((*(uint *)((ulong)uVar3 - 4) >> 8 & 0xff) + 1) * -8;
    }
    else {
      iVar4._0_1_ = (local_28->cur).marked;
      iVar4._1_1_ = (local_28->cur).gct;
      iVar4._2_2_ = (local_28->cur).nsnap;
      lVar6 = -((long)iVar4 & 0xfffffffffffffff8U);
    }
    in_stack_ffffffffffffffc0 = (jit_State *)((long)&(local_28->cur).nextgc.gcptr32 + lVar6);
    if (*(int *)((ulong)(in_stack_ffffffffffffffc0->cur).nextgc.gcptr32 + 0x10) ==
        *(int *)((ulong)(pGVar5->nextgc).gcptr32 + 0x10)) {
      local_38 = local_38 + 1;
    }
    local_28 = in_stack_ffffffffffffffc0;
  }
  if (*(long *)(in_RDI + 0x70) == *(long *)(in_RDI + 0x9a0)) {
    if (*(int *)(in_RDI + 0x674) < local_38 + *(int *)(in_RDI + 0xe0)) {
      *(long *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 4;
      if (*(int *)(in_RDI + 0xe4) + *(int *)(in_RDI + 0xe8) == 0) {
        lj_record_stop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                      );
      }
      else {
        lj_record_stop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                      );
      }
    }
  }
  else if (*(int *)(in_RDI + 0x670) < local_38) {
    if (in_ESI != 0) {
      lj_trace_flush(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      *(int *)(in_RDI + 0x904) = *(int *)(in_RDI + 0x904) * 0x41c64e6d + 0x3039;
      *(ushort *)
       (in_RDI + 0xa20 + (ulong)((int)*(undefined8 *)(in_RDI + 0x70) + 4U >> 2 & 0x3f) * 2) =
           (ushort)((uint)*(undefined4 *)(in_RDI + 0x904) >> 0x1c);
    }
    lj_trace_err(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static void check_call_unroll(jit_State *J, TraceNo lnk)
{
  cTValue *frame = J->L->base - 1;
  void *pc = mref(frame_func(frame)->l.pc, void);
  int32_t depth = J->framedepth;
  int32_t count = 0;
  if ((J->pt->flags & PROTO_VARARG)) depth--;  /* Vararg frame still missing. */
  for (; depth > 0; depth--) {  /* Count frames with same prototype. */
    if (frame_iscont(frame)) depth--;
    frame = frame_prev(frame);
    if (mref(frame_func(frame)->l.pc, void) == pc)
      count++;
  }
  if (J->pc == J->startpc) {
    if (count + J->tailcalled > J->param[JIT_P_recunroll]) {
      J->pc++;
      if (J->framedepth + J->retdepth == 0)
	lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Tail-rec. */
      else
	lj_record_stop(J, LJ_TRLINK_UPREC, J->cur.traceno);  /* Up-recursion. */
    }
  } else {
    if (count > J->param[JIT_P_callunroll]) {
      if (lnk) {  /* Possible tail- or up-recursion. */
	lj_trace_flush(J, lnk);  /* Flush trace that only returns. */
	/* Set a small, pseudo-random hotcount for a quick retry of JFUNC*. */
	hotcount_set(J2GG(J), J->pc+1, LJ_PRNG_BITS(J, 4));
      }
      lj_trace_err(J, LJ_TRERR_CUNROLL);
    }
  }
}